

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

char * __thiscall pybind11::error_already_set::what(error_already_set *this)

{
  pointer pcVar1;
  string *psVar2;
  error_scope scope;
  gil_scoped_acquire gil;
  error_scope local_30;
  gil_scoped_acquire local_18;
  
  gil_scoped_acquire::gil_scoped_acquire(&local_18);
  PyErr_Fetch(&local_30,&local_30.value,&local_30.trace);
  psVar2 = detail::error_fetch_and_normalize::error_string_abi_cxx11_
                     ((this->m_fetched_error).
                      super___shared_ptr<pybind11::detail::error_fetch_and_normalize,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  error_scope::~error_scope(&local_30);
  gil_scoped_acquire::~gil_scoped_acquire(&local_18);
  return pcVar1;
}

Assistant:

inline const char *error_already_set::what() const noexcept {
    gil_scoped_acquire gil;
    error_scope scope;
    return m_fetched_error->error_string().c_str();
}